

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateSmallDenseSeeds.cpp
# Opt level: O0

uint16_t LinearInterpolate(uint N0,uint N1,uint Count0,uint Count1,uint N)

{
  uint count;
  uint denominator;
  uint numerator;
  uint N_local;
  uint Count1_local;
  uint Count0_local;
  uint N1_local;
  uint N0_local;
  
  return (short)Count0 + (short)(((N - N0) * (Count1 - Count0)) / (N1 - N0));
}

Assistant:

static uint16_t LinearInterpolate(
    unsigned N0,
    unsigned N1,
    unsigned Count0,
    unsigned Count1,
    unsigned N)
{
    CAT_DEBUG_ASSERT(N >= N0 && N <= N1);
    CAT_DEBUG_ASSERT(Count1 > Count0);

    const unsigned numerator = (N - N0) * (Count1 - Count0);
    const unsigned denominator = N1 - N0;

    const unsigned count = Count0 + (unsigned)(numerator / denominator);

    return static_cast<uint16_t>(count);
}